

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O0

string * generate_page_buttons_abi_cxx11_(string *__return_storage_ptr__,LadderDatabase *db)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_100;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  string local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  string local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  long local_60;
  size_t page_index;
  size_t entry_index;
  size_t local_40;
  size_t entries_per_page;
  ulong local_28;
  size_t entry_count;
  LadderDatabase *local_18;
  LadderDatabase *db_local;
  string *result;
  
  entry_count._7_1_ = 0;
  local_18 = db;
  db_local = (LadderDatabase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = RenX::LadderDatabase::getEntries();
  local_40 = RenX_Ladder_WebPlugin::getEntriesPerPage(&pluginInstance);
  _entry_index = sv("<div id=\"leaderboard-paging\">",0x1d);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&entry_index);
  local_60 = 1;
  for (page_index = 0; page_index < local_28; page_index = local_40 + page_index) {
    local_70 = sv("<span class=\"leaderboard-page\"><a href=\"?start=",0x2f);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_70);
    string_printf_abi_cxx11_(&local_90,"%u",page_index);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (local_18 != RenX::default_ladder_database) {
      local_a0 = sv("&database=",10);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_a0);
      bVar1 = (basic_string_view<char,_std::char_traits<char>_>)RenX::LadderDatabase::getName();
      local_b0 = bVar1;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_b0);
    }
    local_c0 = sv("\">",2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_c0);
    string_printf_abi_cxx11_(&local_e0,"%u",local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    local_f0 = sv("</a></span>",0xb);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_f0);
    local_60 = local_60 + 1;
  }
  local_100 = sv("</div>",6);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,&local_100);
  return __return_storage_ptr__;
}

Assistant:

std::string generate_page_buttons(RenX::LadderDatabase *db) {
	std::string result;
	size_t entry_count = db->getEntries();
	size_t entries_per_page = pluginInstance.getEntriesPerPage();

	result = R"html(<div id="leaderboard-paging">)html"sv;

	size_t entry_index = 0, page_index = 1;
	while (entry_index < entry_count) {
		// Add page
		result += R"html(<span class="leaderboard-page"><a href="?start=)html"sv;
		result += string_printf("%u", entry_index);
		if (db != RenX::default_ladder_database) {
			result += "&database="sv;
			result += db->getName();
		}
		result += R"html(">)html"sv;
		result += string_printf("%u", page_index);
		result += R"html(</a></span>)html"sv;

		// Increment indexes
		entry_index += entries_per_page;
		++page_index;
	}

	result += R"html(</div>)html"sv;
	return result;
}